

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> * __thiscall
cmLocalNinjaGenerator::MakeCustomCommandGenerators
          (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
           *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommand *cc,
          string *fileConfig)

{
  _Rb_tree_header *p_Var1;
  cmGlobalNinjaGenerator *this_00;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  PolicyStatus PVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  size_type sVar7;
  _Base_ptr p_Var8;
  pointer pbVar9;
  string *output;
  cmCustomCommandGenerator *ccg;
  cmCustomCommandGenerator *this_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  bool transformDepfile;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *ccgs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allOutputs;
  bool local_99;
  vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>> *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  this_00 = (cmGlobalNinjaGenerator *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  local_99 = false;
  local_98 = (vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>> *)
             __return_storage_ptr__;
  PVar5 = cmCustomCommand::GetCMP0116Status(cc);
  if (PVar5 - NEW < 3) {
    local_99 = true;
  }
  *(undefined8 *)(local_98 + 0x10) = 0;
  *(undefined8 *)local_98 = 0;
  *(undefined8 *)(local_98 + 8) = 0;
  local_90._M_impl._0_8_ = this;
  std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>::
  emplace_back<cmCustomCommand_const&,std::__cxx11::string_const&,cmLocalNinjaGenerator*,bool&>
            (local_98,cc,fileConfig,(cmLocalNinjaGenerator **)&local_90,&local_99);
  bVar4 = cmGlobalNinjaGenerator::EnableCrossConfigBuild(this_00);
  if (!bVar4) {
    return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)local_98;
  }
  pvVar6 = cmCustomCommand::GetOutputs_abi_cxx11_(cc);
  pbVar9 = (pvVar6->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pvVar6->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while (pbVar9 != pbVar2) {
    sVar7 = cmGeneratorExpression::Find(pbVar9);
    pbVar9 = pbVar9 + 1;
    if (sVar7 == 0xffffffffffffffff) {
      return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)local_98
      ;
    }
  }
  pvVar6 = cmCustomCommand::GetByproducts_abi_cxx11_(cc);
  pbVar9 = (pvVar6->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pvVar6->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while (pbVar9 != pbVar2) {
    sVar7 = cmGeneratorExpression::Find(pbVar9);
    pbVar9 = pbVar9 + 1;
    if (sVar7 == 0xffffffffffffffff) {
      return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)local_98
      ;
    }
  }
  cmGlobalNinjaGenerator::GetCrossConfigs
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_90,this_00,fileConfig);
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  for (p_Var8 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    bVar4 = std::operator!=(fileConfig,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var8 + 1));
    if (bVar4) {
      local_60._M_impl._0_8_ = this;
      std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>::
      emplace_back<cmCustomCommand_const&,std::__cxx11::string_const&,cmLocalNinjaGenerator*,bool&,std::__cxx11::string_const&>
                (local_98,cc,fileConfig,(cmLocalNinjaGenerator **)&local_60,&local_99,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1));
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = *(cmCustomCommandGenerator **)local_98;
  pcVar3 = *(pointer *)(local_98 + 8);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (this_01 == pcVar3) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_90);
      return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)local_98
      ;
    }
    pvVar6 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(this_01);
    pbVar9 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while (pbVar9 != pbVar2) {
      pVar10 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&local_90,pbVar9);
      pbVar9 = pbVar9 + 1;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_003605c2;
    }
    pvVar6 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_(this_01);
    pbVar9 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while (pbVar9 != pbVar2) {
      pVar10 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&local_60,pbVar9);
      pbVar9 = pbVar9 + 1;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_003605c2:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_60);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_90);
        std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::erase
                  ((vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
                   local_98,(cmCustomCommandGenerator *)(*(long *)local_98 + 0x160),
                   *(cmCustomCommandGenerator **)(local_98 + 8));
        return (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *)
               local_98;
      }
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

std::vector<cmCustomCommandGenerator>
cmLocalNinjaGenerator::MakeCustomCommandGenerators(
  cmCustomCommand const& cc, std::string const& fileConfig)
{
  cmGlobalNinjaGenerator const* gg = this->GetGlobalNinjaGenerator();

  bool transformDepfile = false;
  switch (cc.GetCMP0116Status()) {
    case cmPolicies::WARN:
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      transformDepfile = true;
      break;
  }

  // Start with the build graph's configuration.
  std::vector<cmCustomCommandGenerator> ccgs;
  ccgs.emplace_back(cc, fileConfig, this, transformDepfile);

  // Consider adding cross configurations.
  if (!gg->EnableCrossConfigBuild()) {
    return ccgs;
  }

  // Outputs and byproducts must be expressed using generator expressions.
  for (std::string const& output : cc.GetOutputs()) {
    if (cmGeneratorExpression::Find(output) == std::string::npos) {
      return ccgs;
    }
  }
  for (std::string const& byproduct : cc.GetByproducts()) {
    if (cmGeneratorExpression::Find(byproduct) == std::string::npos) {
      return ccgs;
    }
  }

  // Tentatively add the other cross configurations.
  for (std::string const& config : gg->GetCrossConfigs(fileConfig)) {
    if (fileConfig != config) {
      ccgs.emplace_back(cc, fileConfig, this, transformDepfile, config);
    }
  }

  // If outputs and byproducts are not unique to each configuration,
  // drop the cross configurations.
  if (!HasUniqueOutputs(ccgs)) {
    ccgs.erase(ccgs.begin() + 1, ccgs.end());
  }

  return ccgs;
}